

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString> *this)

{
  QString::~QString((QString *)0x25e280);
  QStringBuilder<QStringBuilder<QString,_QString>,_char>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_QString>,_char> *)0x25e28a);
  return;
}

Assistant:

~QStringBuilder() = default;